

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_CCtx_refPrefix(ZSTD_CCtx *cctx,void *prefix,size_t prefixSize)

{
  size_t sVar1;
  size_t prefixSize_local;
  void *prefix_local;
  ZSTD_CCtx *cctx_local;
  
  sVar1 = ZSTD_CCtx_refPrefix_advanced(cctx,prefix,prefixSize,ZSTD_dct_rawContent);
  return sVar1;
}

Assistant:

size_t ZSTD_CCtx_refPrefix(ZSTD_CCtx* cctx, const void* prefix, size_t prefixSize)
{
    return ZSTD_CCtx_refPrefix_advanced(cctx, prefix, prefixSize, ZSTD_dct_rawContent);
}